

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *__n;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  uint8_t *puVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RCX;
  long in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  void *newBuffer;
  size_t increment;
  size_t in_stack_ffffffffffffffd0;
  uint8_t *local_8;
  
  if (in_RSI == (uint8_t *)0x0) {
    local_8 = (uint8_t *)Malloc(in_RCX,in_stack_ffffffffffffffd0);
  }
  else if (in_RCX == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    __n = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)(in_RDX + 7U & 0xfffffffffffffff8);
    this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
              ((ulong)((long)&in_RCX->chunk_capacity_ + 7U) & 0xfffffffffffffff8);
    local_8 = in_RSI;
    if (__n < this_00) {
      puVar1 = GetChunkBuffer(*(SharedData **)(in_RDI + 0x10));
      if ((in_RSI == puVar1 + (*(long *)(**(long **)(in_RDI + 0x10) + 8) - (long)__n)) &&
         (in_stack_ffffffffffffffd0 = (long)this_00 - (long)__n,
         *(long *)(**(long **)(in_RDI + 0x10) + 8) + in_stack_ffffffffffffffd0 <=
         *(ulong *)**(undefined8 **)(in_RDI + 0x10))) {
        *(size_t *)(**(long **)(in_RDI + 0x10) + 8) =
             in_stack_ffffffffffffffd0 + *(long *)(**(long **)(in_RDI + 0x10) + 8);
      }
      else {
        local_8 = (uint8_t *)Malloc(this_00,in_stack_ffffffffffffffd0);
        if (local_8 == (uint8_t *)0x0) {
          local_8 = (uint8_t *)0x0;
        }
        else if (__n != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
          memcpy(local_8,in_RSI,(size_t)__n);
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (newSize == 0)
            return NULL;

        originalSize = RAPIDJSON_ALIGN(originalSize);
        newSize = RAPIDJSON_ALIGN(newSize);

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == GetChunkBuffer(shared_) + shared_->chunkHead->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            if (shared_->chunkHead->size + increment <= shared_->chunkHead->capacity) {
                shared_->chunkHead->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        if (void* newBuffer = Malloc(newSize)) {
            if (originalSize)
                std::memcpy(newBuffer, originalPtr, originalSize);
            return newBuffer;
        }
        else
            return NULL;
    }